

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

uint8_t __thiscall flexbuffers::Builder::Align(Builder *this,BitWidth alignment)

{
  const_iterator __position;
  uint uVar1;
  value_type_conflict1 local_9;
  
  uVar1 = 1 << ((byte)alignment & 0x1f);
  __position._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_9 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&this->buf_,__position,
             (ulong)uVar1 - 1 &
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)__position._M_current,&local_9);
  return (uint8_t)uVar1;
}

Assistant:

uint8_t Align(BitWidth alignment) {
    auto byte_width = 1U << alignment;
    buf_.insert(buf_.end(), flatbuffers::PaddingBytes(buf_.size(), byte_width),
                0);
    return static_cast<uint8_t>(byte_width);
  }